

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  ImRect r_rel;
  
  pIVar2 = GImGui;
  IVar1 = (this->DC).CursorStartPos;
  fVar5 = IVar1.x;
  fVar6 = IVar1.y;
  r_rel.Min.x = (r_abs->Min).x - fVar5;
  r_rel.Min.y = (r_abs->Min).y - fVar6;
  r_rel.Max.x = (r_abs->Max).x - fVar5;
  r_rel.Max.y = (r_abs->Max).y - fVar6;
  uVar3 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  lVar4 = 0;
  do {
    uVar3 = uVar3 >> 8 ^
            GCrc32LookupTable[(uint)*(byte *)((long)&r_rel.Min.x + lVar4) ^ uVar3 & 0xff];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  uVar3 = ~uVar3;
  if (GImGui->ActiveId == uVar3) {
    GImGui->ActiveIdIsAlive = uVar3;
  }
  if (pIVar2->ActiveIdPreviousFrame == uVar3) {
    pIVar2->ActiveIdPreviousFrameIsAlive = true;
  }
  return uVar3;
}

Assistant:

inline T&           back()                              { IM_ASSERT(Size > 0); return Data[Size - 1]; }